

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxClassPtrCast::Resolve(FxClassPtrCast *this,FCompileContext *ctx)

{
  PPointer *pPVar1;
  PType *this_00;
  PType *pPVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  FxExpression *pFVar6;
  PClass *pPVar7;
  char *pcVar8;
  char *pcVar9;
  PClass *pPVar10;
  FxClassPtrCast *pFVar11;
  bool bVar12;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar6 = this->basex;
  if (pFVar6 != (FxExpression *)0x0) {
    iVar4 = (*pFVar6->_vptr_FxExpression[2])(pFVar6,ctx);
    this->basex = (FxExpression *)CONCAT44(extraout_var,iVar4);
  }
  pFVar11 = (FxClassPtrCast *)this->basex;
  if (pFVar11 == (FxClassPtrCast *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return &((FxClassPtrCast *)0x0)->super_FxExpression;
  }
  pPVar1 = (PPointer *)(pFVar11->super_FxExpression).ValueType;
  this_00 = (this->super_FxExpression).ValueType;
  if (pPVar1 == TypeNullPtr) {
    (pFVar11->super_FxExpression).ValueType = this_00;
    this->basex = (FxExpression *)0x0;
    goto LAB_0053c2da;
  }
  if ((pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class == (PClass *)0x0) {
    iVar4 = (**(pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject._vptr_DObject)
                      (pPVar1);
    (pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var_00,iVar4);
  }
  pFVar11 = (FxClassPtrCast *)this->basex;
  pPVar2 = (pFVar11->super_FxExpression).ValueType;
  if ((pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class ==
      PClassPointer::RegistrationInfo.MyClass) {
    pPVar3 = (PClass *)
             (((PBasicType *)&pPVar2[1].super_PTypeBase)->super_PType).super_PTypeBase.super_DObject
             .ObjNext;
    pPVar7 = (PClass *)this_00[1].super_PTypeBase.super_DObject.ObjNext;
    pPVar10 = pPVar3;
    if (pPVar3 == pPVar7) {
LAB_0053c25e:
      (pFVar11->super_FxExpression).ValueType = this_00;
      this->basex = (FxExpression *)0x0;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      bVar12 = false;
    }
    else {
      do {
        pPVar10 = (PClass *)
                  ((TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
                    *)&pPVar10->ParentClass)->Array;
        if (pPVar10 == pPVar7) break;
      } while (pPVar10 != (PClass *)0x0);
      if (pPVar10 != (PClass *)0x0) goto LAB_0053c25e;
      pFVar11 = this;
      if (pPVar3 == pPVar7) {
        bVar12 = false;
      }
      else {
        do {
          pPVar7 = (PClass *)
                   ((TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
                     *)&pPVar7->ParentClass)->Array;
          if (pPVar7 == pPVar3) break;
        } while (pPVar7 != (PClass *)0x0);
        bVar12 = pPVar7 == (PClass *)0x0;
      }
    }
    if (!bVar12) {
      return &pFVar11->super_FxExpression;
    }
  }
  else if ((pPVar2 == (PType *)TypeString) || (pPVar2 == (PType *)TypeName)) {
    plVar5 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar6 = this->basex;
    *plVar5 = (long)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition((FScriptPosition *)(plVar5 + 1),&pFVar6->ScriptPosition);
    *(undefined2 *)(plVar5 + 4) = 0x100;
    *(undefined4 *)((long)plVar5 + 0x24) = 0x34;
    *plVar5 = (long)&PTR__FxClassTypeCast_00711100;
    plVar5[3] = (long)this_00;
    plVar5[5] = (long)this_00[1].super_PTypeBase.super_DObject.ObjNext;
    plVar5[6] = (long)pFVar6;
    this->basex = (FxExpression *)0x0;
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pFVar6 = (FxExpression *)(**(code **)(*plVar5 + 0x10))(plVar5,ctx);
    return pFVar6;
  }
  pcVar8 = PType::DescriptiveName(this->basex->ValueType);
  pcVar9 = PType::DescriptiveName(this_00);
  pFVar11 = (FxClassPtrCast *)0x0;
  FScriptPosition::Message
            (&(this->super_FxExpression).ScriptPosition,2,
             "Cannot cast %s to %s. The types are incompatible.",pcVar8,pcVar9);
LAB_0053c2da:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return &pFVar11->super_FxExpression;
}

Assistant:

FxExpression *FxClassPtrCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeNullPtr)
	{
		basex->ValueType = ValueType;
		auto x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	auto to = static_cast<PClassPointer *>(ValueType);
	if (basex->ValueType->GetClass() == RUNTIME_CLASS(PClassPointer))
	{
		auto from = static_cast<PClassPointer *>(basex->ValueType);
		// Downcast is always ok.
		if (from->ClassRestriction->IsDescendantOf(to->ClassRestriction))
		{
			basex->ValueType = to;
			auto x = basex;
			basex = nullptr;
			delete this;
			return x;
		}
		// Upcast needs a runtime check.
		else if (to->ClassRestriction->IsDescendantOf(from->ClassRestriction))
		{
			return this;
		}
	}
	else if (basex->ValueType == TypeString || basex->ValueType == TypeName)
	{
		FxExpression *x = new FxClassTypeCast(to, basex);
		basex = nullptr;
		delete this;
		return x->Resolve(ctx);
	}
	// Everything else is an error.
	ScriptPosition.Message(MSG_ERROR, "Cannot cast %s to %s. The types are incompatible.", basex->ValueType->DescriptiveName(), to->DescriptiveName());
	delete this;
	return nullptr;
}